

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  secp256k1_gej *__src;
  secp256k1_gej *__src_00;
  secp256k1_gej *psVar5;
  secp256k1_fe *psVar6;
  secp256k1_fe *psVar7;
  secp256k1_fe *psVar8;
  bool bVar9;
  secp256k1_fe sStack_268;
  secp256k1_fe *psStack_238;
  secp256k1_fe sStack_228;
  secp256k1_fe sStack_1f8;
  secp256k1_fe sStack_1c8;
  secp256k1_fe sStack_190;
  secp256k1_fe sStack_160;
  secp256k1_fe sStack_130;
  secp256k1_gej *psStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_fe *psStack_e8;
  undefined1 *puStack_e0;
  secp256k1_fe *psStack_d8;
  secp256k1_fe *psStack_d0;
  secp256k1_gej sStack_c8;
  
  __src_00 = &sStack_c8;
  psVar5 = &sStack_c8;
  psStack_d0 = (secp256k1_fe *)0x157bea;
  memcpy(&sStack_c8,a,0x98);
  psStack_d0 = (secp256k1_fe *)0x157bf2;
  secp256k1_gej_verify(&sStack_c8);
  psStack_d0 = (secp256k1_fe *)0x157bfa;
  secp256k1_gej_verify(b);
  psStack_d0 = (secp256k1_fe *)0x157c07;
  secp256k1_fe_cmov(&sStack_c8.x,&b->x,0);
  psVar6 = &b->y;
  psStack_d0 = (secp256k1_fe *)0x157c1a;
  secp256k1_fe_cmov(&sStack_c8.y,psVar6,0);
  psVar8 = &sStack_c8.z;
  psVar7 = &b->z;
  psStack_d0 = (secp256k1_fe *)0x157c30;
  secp256k1_fe_cmov(psVar8,psVar7,0);
  psStack_d0 = (secp256k1_fe *)0x157c38;
  secp256k1_gej_verify(&sStack_c8);
  psStack_d0 = (secp256k1_fe *)0x157c43;
  __src = a;
  iVar3 = gej_xyz_equals_gej(&sStack_c8,a);
  if (iVar3 == 0) {
    psStack_d0 = (secp256k1_fe *)0x157cda;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_d0 = (secp256k1_fe *)0x157c56;
    secp256k1_gej_verify(&sStack_c8);
    psStack_d0 = (secp256k1_fe *)0x157c5e;
    secp256k1_gej_verify(b);
    psStack_d0 = (secp256k1_fe *)0x157c6e;
    secp256k1_fe_cmov(&sStack_c8.x,&b->x,1);
    psStack_d0 = (secp256k1_fe *)0x157c80;
    secp256k1_fe_cmov(&sStack_c8.y,psVar6,1);
    psStack_d0 = (secp256k1_fe *)0x157c90;
    secp256k1_fe_cmov(psVar8,psVar7,1);
    sStack_c8.infinity = sStack_c8.infinity & 0xfffffffeU | b->infinity & 1U;
    psStack_d0 = (secp256k1_fe *)0x157cb4;
    secp256k1_gej_verify(&sStack_c8);
    psStack_d0 = (secp256k1_fe *)0x157cbf;
    __src = b;
    iVar3 = gej_xyz_equals_gej(&sStack_c8,b);
    __src_00 = psVar5;
    if (iVar3 != 0) {
      return;
    }
  }
  psStack_d0 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_d0 = psVar7;
  psStack_d8 = psVar6;
  puStack_e0 = (undefined1 *)&sStack_c8;
  psStack_e8 = psVar8;
  psStack_f0 = a;
  psStack_f8 = b;
  if ((*(int *)((long)__src_00 + 0x90) != __src->infinity) || (*(int *)((long)__src_00 + 0x90) != 0)
     ) {
    return;
  }
  psStack_238 = (secp256k1_fe *)0x157d2c;
  memcpy(&sStack_190,__src_00,0x98);
  psVar6 = &sStack_228;
  psStack_238 = (secp256k1_fe *)0x157d41;
  memcpy(psVar6,__src,0x98);
  psStack_238 = (secp256k1_fe *)0x157d49;
  secp256k1_fe_normalize(&sStack_190);
  psStack_238 = (secp256k1_fe *)0x157d59;
  secp256k1_fe_normalize(&sStack_160);
  psStack_238 = (secp256k1_fe *)0x157d69;
  secp256k1_fe_normalize(&sStack_130);
  psStack_238 = (secp256k1_fe *)0x157d71;
  secp256k1_fe_normalize(psVar6);
  psVar7 = &sStack_1f8;
  psStack_238 = (secp256k1_fe *)0x157d7e;
  secp256k1_fe_normalize(psVar7);
  psVar8 = &sStack_1c8;
  psStack_238 = (secp256k1_fe *)0x157d8b;
  secp256k1_fe_normalize(psVar8);
  psStack_238 = (secp256k1_fe *)0x157d93;
  secp256k1_fe_verify(&sStack_190);
  psStack_238 = (secp256k1_fe *)0x157d9b;
  secp256k1_fe_verify(psVar6);
  if (sStack_190.normalized == 0) {
    psStack_238 = (secp256k1_fe *)0x157ea0;
    gej_xyz_equals_gej_cold_6();
LAB_00157ea0:
    psVar7 = psVar6;
    psStack_238 = (secp256k1_fe *)0x157ea5;
    gej_xyz_equals_gej_cold_5();
LAB_00157ea5:
    psStack_238 = (secp256k1_fe *)0x157eaa;
    gej_xyz_equals_gej_cold_4();
LAB_00157eaa:
    psVar8 = psVar7;
    psStack_238 = (secp256k1_fe *)0x157eaf;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_228.normalized == 0) goto LAB_00157ea0;
    uVar4 = 4;
    do {
      uVar1 = sStack_228.n[uVar4];
      uVar2 = sStack_190.n[uVar4];
      if ((uVar2 >= uVar1 && uVar2 != uVar1) || (uVar2 < uVar1)) break;
      bVar9 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar9);
    psStack_238 = (secp256k1_fe *)0x157de5;
    secp256k1_fe_verify(&sStack_160);
    psStack_238 = (secp256k1_fe *)0x157ded;
    secp256k1_fe_verify(psVar7);
    if (sStack_160.normalized == 0) goto LAB_00157ea5;
    if (sStack_1f8.normalized == 0) goto LAB_00157eaa;
    uVar4 = 4;
    do {
      uVar1 = sStack_1f8.n[uVar4];
      uVar2 = sStack_160.n[uVar4];
      if ((uVar2 >= uVar1 && uVar2 != uVar1) || (uVar2 < uVar1)) break;
      bVar9 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar9);
    psStack_238 = (secp256k1_fe *)0x157e3e;
    secp256k1_fe_verify(&sStack_130);
    psStack_238 = (secp256k1_fe *)0x157e46;
    secp256k1_fe_verify(psVar8);
    if (sStack_130.normalized != 0) {
      if (sStack_1c8.normalized != 0) {
        uVar4 = 4;
        do {
          if (sStack_130.n[uVar4] != sStack_1c8.n[uVar4]) {
            return;
          }
          bVar9 = uVar4 != 0;
          uVar4 = uVar4 - 1;
        } while (bVar9);
        return;
      }
      goto LAB_00157eb4;
    }
  }
  psStack_238 = (secp256k1_fe *)0x157eb4;
  gej_xyz_equals_gej_cold_2();
LAB_00157eb4:
  psStack_238 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar8[3].n[0] != 0) {
    return;
  }
  psStack_238 = &sStack_130;
  secp256k1_fe_mul(&sStack_268,psVar8 + 1,psVar8 + 2);
  secp256k1_fe_is_square_var(&sStack_268);
  return;
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}